

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void aom_comp_mask_pred_avx2
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i s1;
  __m256i s1_00;
  __m256i s1_01;
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  long in_stack_00000008;
  __m256i aA_1;
  __m256i sA1_1;
  __m256i sA0_1;
  int x;
  __m256i aB;
  __m256i sB1;
  __m256i sB0;
  __m256i aA;
  __m256i sA1;
  __m256i sA0;
  int stride1;
  int stride0;
  uint8_t *src1;
  uint8_t *src0;
  int i;
  uint8_t *in_stack_fffffffffffffdf8;
  uint8_t *in_stack_fffffffffffffe00;
  int local_1f8;
  long local_1f0;
  long local_1e8;
  int in_stack_fffffffffffffe8c;
  uint8_t *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  int iVar2;
  uint8_t *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  uint8_t *in_stack_fffffffffffffeb0;
  long local_80;
  long local_78;
  int iVar3;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  longlong in_stack_ffffffffffffffd0;
  __m256i in_stack_ffffffffffffffd8;
  
  iVar3 = 0;
  local_1e8 = in_R8;
  if (mask_stride != 0) {
    local_1e8 = in_RSI;
  }
  local_78 = local_1e8;
  local_1f0 = in_RSI;
  if (mask_stride != 0) {
    local_1f0 = in_R8;
  }
  local_80 = local_1f0;
  local_1f8 = in_EDX;
  iVar1 = in_R9D;
  if (mask_stride != 0) {
    local_1f8 = in_R9D;
    iVar1 = in_EDX;
  }
  if (in_EDX == 8) {
    comp_mask_pred_8_ssse3
              (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe8c,(uint8_t *)sA1[3],(int)sA0[0]);
  }
  else if (in_EDX == 0x10) {
    uVar4 = 0x10;
    do {
      mm256_loadu2(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      mm256_loadu2(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      mm256_loadu2(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      in_stack_00000008 = in_stack_00000008 + ((int)mask << 1);
      mm256_loadu2(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      mm256_loadu2(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      mm256_loadu2(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      in_stack_00000008 = in_stack_00000008 + ((int)mask << 1);
      s1[1] = in_stack_ffffffffffffffc0;
      s1[0] = in_stack_ffffffffffffffb8;
      s1[2] = in_stack_ffffffffffffffc8;
      s1[3] = in_stack_ffffffffffffffd0;
      a[1]._0_4_ = in_ECX;
      a[0] = in_R8;
      a[1]._4_4_ = uVar4;
      a[2] = in_RSI;
      a[3] = in_RDI;
      comp_mask_pred_line_avx2(in_stack_ffffffffffffffd8,s1,a,(uint8_t *)CONCAT44(in_R9D,iVar3));
      s1_00[1] = in_stack_ffffffffffffffc0;
      s1_00[0] = in_stack_ffffffffffffffb8;
      s1_00[2] = in_stack_ffffffffffffffc8;
      s1_00[3] = in_stack_ffffffffffffffd0;
      a_00[1]._0_4_ = in_ECX;
      a_00[0] = in_R8;
      a_00[1]._4_4_ = uVar4;
      a_00[2] = in_RSI;
      a_00[3] = in_RDI;
      comp_mask_pred_line_avx2
                (in_stack_ffffffffffffffd8,s1_00,a_00,(uint8_t *)CONCAT44(in_R9D,iVar3));
      in_RDI = in_RDI + 0x40;
      iVar3 = iVar3 + 4;
    } while (iVar3 < in_ECX);
  }
  else {
    do {
      for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 0x20) {
        vlddqu_avx(*(undefined1 (*) [32])(local_78 + iVar2));
        vlddqu_avx(*(undefined1 (*) [32])(local_80 + iVar2));
        vlddqu_avx(*(undefined1 (*) [32])(in_stack_00000008 + iVar2));
        s1_01[1] = (longlong)(local_80 + iVar2);
        s1_01[0] = (longlong)(in_stack_00000008 + iVar2);
        s1_01[2] = (longlong)(local_78 + iVar2);
        s1_01[3] = in_stack_ffffffffffffffd0;
        a_01[1]._0_4_ = in_ECX;
        a_01[0] = in_R8;
        a_01[1]._4_4_ = in_EDX;
        a_01[2] = in_RSI;
        a_01[3] = in_RDI;
        comp_mask_pred_line_avx2
                  (in_stack_ffffffffffffffd8,s1_01,a_01,(uint8_t *)CONCAT44(in_R9D,iVar3));
        in_RDI = in_RDI + 0x20;
      }
      local_78 = local_78 + iVar1;
      local_80 = local_80 + local_1f8;
      in_stack_00000008 = in_stack_00000008 + (int)mask;
      iVar3 = iVar3 + 1;
    } while (iVar3 < in_ECX);
  }
  return;
}

Assistant:

void aom_comp_mask_pred_avx2(uint8_t *comp_pred, const uint8_t *pred, int width,
                             int height, const uint8_t *ref, int ref_stride,
                             const uint8_t *mask, int mask_stride,
                             int invert_mask) {
  int i = 0;
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  if (width == 8) {
    comp_mask_pred_8_ssse3(comp_pred, height, src0, stride0, src1, stride1,
                           mask, mask_stride);
  } else if (width == 16) {
    do {
      const __m256i sA0 = mm256_loadu2(src0 + stride0, src0);
      const __m256i sA1 = mm256_loadu2(src1 + stride1, src1);
      const __m256i aA = mm256_loadu2(mask + mask_stride, mask);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      const __m256i sB0 = mm256_loadu2(src0 + stride0, src0);
      const __m256i sB1 = mm256_loadu2(src1 + stride1, src1);
      const __m256i aB = mm256_loadu2(mask + mask_stride, mask);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      // comp_pred's stride == width == 16
      comp_mask_pred_line_avx2(sA0, sA1, aA, comp_pred);
      comp_mask_pred_line_avx2(sB0, sB1, aB, comp_pred + 32);
      comp_pred += (16 << 2);
      i += 4;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        const __m256i sA0 = _mm256_lddqu_si256((const __m256i *)(src0 + x));
        const __m256i sA1 = _mm256_lddqu_si256((const __m256i *)(src1 + x));
        const __m256i aA = _mm256_lddqu_si256((const __m256i *)(mask + x));

        comp_mask_pred_line_avx2(sA0, sA1, aA, comp_pred);
        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i++;
    } while (i < height);
  }
}